

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

DayPeriod icu_63::DayPeriodRules::getDayPeriodFromString(char *type_str)

{
  int iVar1;
  DayPeriod DVar2;
  
  iVar1 = strcmp(type_str,"midnight");
  if (iVar1 == 0) {
    DVar2 = DAYPERIOD_MIDNIGHT;
  }
  else {
    iVar1 = strcmp(type_str,"noon");
    if (iVar1 == 0) {
      DVar2 = DAYPERIOD_NOON;
    }
    else {
      iVar1 = strcmp(type_str,"morning1");
      if (iVar1 == 0) {
        DVar2 = DAYPERIOD_MORNING1;
      }
      else {
        iVar1 = strcmp(type_str,"afternoon1");
        if (iVar1 == 0) {
          DVar2 = DAYPERIOD_AFTERNOON1;
        }
        else {
          iVar1 = strcmp(type_str,"evening1");
          if (iVar1 == 0) {
            DVar2 = DAYPERIOD_EVENING1;
          }
          else {
            iVar1 = strcmp(type_str,"night1");
            if (iVar1 == 0) {
              DVar2 = DAYPERIOD_NIGHT1;
            }
            else {
              iVar1 = strcmp(type_str,"morning2");
              if (iVar1 == 0) {
                DVar2 = DAYPERIOD_MORNING2;
              }
              else {
                iVar1 = strcmp(type_str,"afternoon2");
                if (iVar1 == 0) {
                  DVar2 = DAYPERIOD_AFTERNOON2;
                }
                else {
                  iVar1 = strcmp(type_str,"evening2");
                  if (iVar1 == 0) {
                    DVar2 = DAYPERIOD_EVENING2;
                  }
                  else {
                    iVar1 = strcmp(type_str,"night2");
                    if (iVar1 == 0) {
                      DVar2 = DAYPERIOD_NIGHT2;
                    }
                    else {
                      if (*type_str == 'p') {
                        if (type_str[1] != 'm') {
                          return DAYPERIOD_UNKNOWN;
                        }
                        DVar2 = DAYPERIOD_PM;
                      }
                      else {
                        if (*type_str != 'a') {
                          return DAYPERIOD_UNKNOWN;
                        }
                        if (type_str[1] != 'm') {
                          return DAYPERIOD_UNKNOWN;
                        }
                        DVar2 = DAYPERIOD_AM;
                      }
                      DVar2 = -(uint)(type_str[2] != '\0') | DVar2;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return DVar2;
}

Assistant:

DayPeriodRules::DayPeriod DayPeriodRules::getDayPeriodFromString(const char *type_str) {
    if (uprv_strcmp(type_str, "midnight") == 0) {
        return DAYPERIOD_MIDNIGHT;
    } else if (uprv_strcmp(type_str, "noon") == 0) {
        return DAYPERIOD_NOON;
    } else if (uprv_strcmp(type_str, "morning1") == 0) {
        return DAYPERIOD_MORNING1;
    } else if (uprv_strcmp(type_str, "afternoon1") == 0) {
        return DAYPERIOD_AFTERNOON1;
    } else if (uprv_strcmp(type_str, "evening1") == 0) {
        return DAYPERIOD_EVENING1;
    } else if (uprv_strcmp(type_str, "night1") == 0) {
        return DAYPERIOD_NIGHT1;
    } else if (uprv_strcmp(type_str, "morning2") == 0) {
        return DAYPERIOD_MORNING2;
    } else if (uprv_strcmp(type_str, "afternoon2") == 0) {
        return DAYPERIOD_AFTERNOON2;
    } else if (uprv_strcmp(type_str, "evening2") == 0) {
        return DAYPERIOD_EVENING2;
    } else if (uprv_strcmp(type_str, "night2") == 0) {
        return DAYPERIOD_NIGHT2;
    } else if (uprv_strcmp(type_str, "am") == 0) {
        return DAYPERIOD_AM;
    } else if (uprv_strcmp(type_str, "pm") == 0) {
        return DAYPERIOD_PM;
    } else {
        return DAYPERIOD_UNKNOWN;
    }
}